

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::GatherGLSLCompile::Run(GatherGLSLCompile *this)

{
  long *src_vs;
  bool bVar1;
  GLuint GVar2;
  bool *compile_error;
  long *local_50 [2];
  long local_40 [2];
  long *local_30 [2];
  long local_20 [2];
  
  (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xb])(local_30,this);
  src_vs = local_30[0];
  (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc])(local_50,this);
  GVar2 = TGBase::CreateProgram(&this->super_TGBase,(char *)src_vs,(char *)local_50[0]);
  this->program = GVar2;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->program);
  bVar1 = TGBase::CheckProgram(&this->super_TGBase,this->program,compile_error);
  return (ulong)bVar1 - 1;
}

Assistant:

virtual long Run()
	{
		program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str());
		glLinkProgram(program);
		if (!CheckProgram(program))
			return ERROR;
		return NO_ERROR;
	}